

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmElfRelocator.cpp
# Opt level: O1

bool __thiscall
ArmElfRelocator::relocateOpcode
          (ArmElfRelocator *this,int type,RelocationData *data,
          vector<RelocationAction,_std::allocator<RelocationAction>_> *actions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *errors)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  uint local_40;
  int local_3c;
  string local_38;
  
  bVar9 = data->targetSymbolType == 2;
  bVar10 = data->targetSymbolInfo != 0;
  iVar1 = (int)data->opcodeOffset;
  uVar2 = data->relocationBase;
  uVar3 = data->opcode;
  iVar6 = (int)uVar2;
  local_40 = uVar3;
  local_3c = type;
  if (type < 0x1c) {
    if (type == 2) {
LAB_0015ef66:
      local_40 = uVar3 + iVar6 | (uint)(bVar10 && bVar9);
    }
    else {
      if (type != 10) goto LAB_0015efdd;
      if (bVar10 && bVar9) {
        if ((uVar2 & 1) != 0) goto LAB_0015f025;
        uVar7 = uVar3 >> 0x10 & 0xf800;
      }
      else {
        if (this->arm9 == false) {
          pcVar4 = "Cannot call ARM function from THUMB code without stub";
LAB_0015f141:
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[54]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                     (char (*) [54])pcVar4);
          goto LAB_0015f149;
        }
        if ((uVar2 & 3) != 0) goto LAB_0015f045;
        uVar7 = 0xe800;
      }
      uVar8 = (iVar6 - iVar1) + ((int)(uVar3 >> 6 & 0x1ffc00 | uVar3 << 0x15) >> 9);
      uVar5 = -uVar8;
      if (0 < (int)uVar8) {
        uVar5 = uVar8;
      }
      if (0x3fffff < uVar5) {
        tinyformat::format<long>(&local_38,"Branch target %08X out of range",&data->relocationBase);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   &local_38);
        goto LAB_0015f001;
      }
      local_40 = (uVar7 | uVar8 >> 1 & 0x7ff) << 0x10 | uVar8 >> 0xc & 0x7ff | uVar3 & 0xf800;
    }
LAB_0015ef75:
    std::vector<RelocationAction,std::allocator<RelocationAction>>::
    emplace_back<long_const&,unsigned_int&>
              ((vector<RelocationAction,std::allocator<RelocationAction>> *)actions,
               &data->opcodeOffset,&local_40);
    bVar9 = true;
  }
  else {
    if (type - 0x1cU < 2) {
      local_40 = uVar3 & 0xff000000;
      uVar7 = iVar6 - iVar1;
      if (bVar10 && bVar9) {
        if ((uVar2 & 1) == 0) {
          if (type == 0x1d) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[43]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                       (char (*) [43])"Cannot jump from ARM to THUMB without link");
            goto LAB_0015f149;
          }
          if (this->arm9 == false) {
            pcVar4 = "Cannot call THUMB function from ARM code without stub";
            goto LAB_0015f141;
          }
          if ((uVar3 & 0xf0000000) == 0xe0000000) {
            local_40 = (uVar7 & 2 | 0xfffffff4) << 0x17;
            goto LAB_0015ef99;
          }
          pcVar4 = "Cannot convert conditional bl into blx";
        }
        else {
LAB_0015f025:
          pcVar4 = "Branch target must be halfword aligned";
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[39]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   (char (*) [39])pcVar4);
      }
      else {
        if ((uVar2 & 3) == 0) {
LAB_0015ef99:
          uVar7 = uVar7 + ((int)(uVar3 << 8) >> 6);
          uVar3 = -uVar7;
          if (0 < (int)uVar7) {
            uVar3 = uVar7;
          }
          if (uVar3 < 0x2000000) {
            local_40 = local_40 | uVar7 >> 2 & 0xffffff;
            goto LAB_0015ef75;
          }
          tinyformat::format<long>
                    (&local_38,"Branch target %08X out of range",&data->relocationBase);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                     &local_38);
          goto LAB_0015f001;
        }
LAB_0015f045:
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[35]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                   (char (*) [35])"Branch target must be word aligned");
      }
    }
    else {
      if (type == 0x26) goto LAB_0015ef66;
LAB_0015efdd:
      tinyformat::format<int>(&local_38,"Unknown ARM relocation type %d",&local_3c);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)errors,
                 &local_38);
LAB_0015f001:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
LAB_0015f149:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool ArmElfRelocator::relocateOpcode(int type, const RelocationData& data, std::vector<RelocationAction>& actions, std::vector<std::string>& errors)
{
	int t = (data.targetSymbolType == STT_FUNC && data.targetSymbolInfo != 0) ? 1 : 0;
	int p = (int) data.opcodeOffset;
	int s = (int) data.relocationBase;

	uint32_t opcode = data.opcode;
	switch (type)
	{
	case R_ARM_ABS32:		// (S + A) | T
	case R_ARM_TARGET1:
		opcode = (int) (opcode + data.relocationBase) | t;
		break;
	case R_ARM_THM_CALL:	// ((S + A) | T) - P
		{
			unsigned short first = opcode & 0xFFFF;
			unsigned short second = (opcode >> 16) & 0xFFFF;
			int opField = ((first & 0x7FF) << 11) | (second & 0x7FF);
			int a = signExtend(opField << 1,23);
			int value = (s+a) - p;

			first &= ~0x7FF;
			second &= ~0x7FF;

			if (t == 1)
			{
				if (data.relocationBase % 2)
				{
					errors.emplace_back("Branch target must be halfword aligned");
					return false;
				}
			} else {
				if (arm9 == false)
				{
					errors.emplace_back("Cannot call ARM function from THUMB code without stub");
					return false;
				}

				if (data.relocationBase % 4)
				{
					errors.emplace_back("Branch target must be word aligned");
					return false;
				}
				
				second = 0xE800;
			}

			if (abs(value) >= 0x400000)
			{
				errors.emplace_back(tfm::format("Branch target %08X out of range",data.relocationBase));
				return false;
			}

			value >>= 1;
			first |= (value >> 11) & 0x7FF;
			second |= value & 0x7FF;
			opcode = first | (second << 16);
		}
		break;
	case R_ARM_CALL:		// ((S + A) | T) - P
	case R_ARM_JUMP24:		// ((S + A) | T) - P
		{
			int condField = (opcode >> 28) & 0xF;
			int opField = (opcode & 0xFFFFFF) << 2;
			opcode &= ~0xFFFFFF;

			int a = signExtend(opField,26);
			int value = (s+a) - p;

			if (t == 1)
			{
				if (data.relocationBase % 2)
				{
					errors.emplace_back("Branch target must be halfword aligned");
					return false;
				}

				if (type == R_ARM_JUMP24)
				{
					errors.emplace_back("Cannot jump from ARM to THUMB without link");
					return false;
				}

				if (arm9 == false)
				{
					errors.emplace_back("Cannot call THUMB function from ARM code without stub");
					return false;
				}

				if (condField != 0xE)
				{
					errors.emplace_back("Cannot convert conditional bl into blx");
					return false;
				}

				opcode = 0xFA000000;
				if (value & 2)
					opcode |= (1 << 24);
			} else {
				if (data.relocationBase % 4)
				{
					errors.emplace_back("Branch target must be word aligned");
					return false;
				}
			}
			
			if (abs(value) >= 0x2000000)
			{
				errors.emplace_back(tfm::format("Branch target %08X out of range",data.relocationBase));
				return false;
			}

			opcode |= (value >> 2) & 0xFFFFFF;
		}
		break;
	default:
		errors.emplace_back(tfm::format("Unknown ARM relocation type %d",type));
		return false;
	}

	actions.emplace_back(data.opcodeOffset, opcode);
	return true;
}